

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_writer.cc
# Opt level: O0

Status __thiscall leveldb::log::Writer::AddRecord(Writer *this,Slice *slice)

{
  long *plVar1;
  bool bVar2;
  Slice *in_RDX;
  ulong local_a8;
  undefined1 local_80 [19];
  bool end;
  RecordType type;
  size_t fragment_length;
  size_t avail;
  Slice local_50;
  Status local_40;
  int local_38;
  byte local_32;
  undefined1 local_31;
  int leftover;
  bool begin;
  size_t left;
  char *ptr;
  Slice *slice_local;
  Writer *this_local;
  Status *s;
  
  ptr = (char *)in_RDX;
  slice_local = slice;
  this_local = this;
  left = (size_t)Slice::data(in_RDX);
  _leftover = Slice::size((Slice *)ptr);
  local_31 = 0;
  Status::Status((Status *)this);
  local_32 = 1;
  while( true ) {
    local_38 = 0x8000 - (int)slice->size_;
    if (local_38 < 0) {
      __assert_fail("leftover >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_writer.cc"
                    ,0x2d,"Status leveldb::log::Writer::AddRecord(const Slice &)");
    }
    if (local_38 < 7) {
      if (0 < local_38) {
        plVar1 = (long *)slice->data_;
        Slice::Slice(&local_50,"",(long)local_38);
        (**(code **)(*plVar1 + 0x10))(&local_40,plVar1,&local_50);
        Status::~Status(&local_40);
      }
      *(undefined4 *)&slice->size_ = 0;
    }
    if (0x7ff9 - (int)slice->size_ < 0) break;
    fragment_length = (size_t)(0x7ff9 - (int)slice->size_);
    local_a8 = fragment_length;
    if (_leftover < fragment_length) {
      local_a8 = _leftover;
    }
    stack0xffffffffffffff90 = local_a8;
    local_80[0xb] = _leftover == local_a8;
    if (((local_32 & 1) == 0) || (!(bool)local_80[0xb])) {
      if ((local_32 & 1) == 0) {
        if ((bool)local_80[0xb]) {
          local_80._12_4_ = 4;
        }
        else {
          local_80._12_4_ = 3;
        }
      }
      else {
        local_80._12_4_ = 2;
      }
    }
    else {
      local_80._12_4_ = 1;
    }
    EmitPhysicalRecord((Writer *)local_80,(RecordType)slice,(char *)(ulong)(uint)local_80._12_4_,
                       left);
    Status::operator=((Status *)this,(Status *)local_80);
    Status::~Status((Status *)local_80);
    left = stack0xffffffffffffff90 + left;
    _leftover = _leftover - stack0xffffffffffffff90;
    local_32 = 0;
    bVar2 = Status::ok((Status *)this);
    if (!bVar2 || _leftover == 0) {
      return (Status)(char *)this;
    }
  }
  __assert_fail("kBlockSize - block_offset_ - kHeaderSize >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_writer.cc"
                ,0x39,"Status leveldb::log::Writer::AddRecord(const Slice &)");
}

Assistant:

Status Writer::AddRecord(const Slice& slice) {
  const char* ptr = slice.data();
  size_t left = slice.size();

  // Fragment the record if necessary and emit it.  Note that if slice
  // is empty, we still want to iterate once to emit a single
  // zero-length record
  Status s;
  bool begin = true;
  do {
    const int leftover = kBlockSize - block_offset_;
    assert(leftover >= 0);
    if (leftover < kHeaderSize) {
      // Switch to a new block
      if (leftover > 0) {
        // Fill the trailer (literal below relies on kHeaderSize being 7)
        static_assert(kHeaderSize == 7, "");
        dest_->Append(Slice("\x00\x00\x00\x00\x00\x00", leftover));
      }
      block_offset_ = 0;
    }

    // Invariant: we never leave < kHeaderSize bytes in a block.
    assert(kBlockSize - block_offset_ - kHeaderSize >= 0);

    const size_t avail = kBlockSize - block_offset_ - kHeaderSize;
    const size_t fragment_length = (left < avail) ? left : avail;

    RecordType type;
    const bool end = (left == fragment_length);
    if (begin && end) {
      type = kFullType;
    } else if (begin) {
      type = kFirstType;
    } else if (end) {
      type = kLastType;
    } else {
      type = kMiddleType;
    }

    s = EmitPhysicalRecord(type, ptr, fragment_length);
    ptr += fragment_length;
    left -= fragment_length;
    begin = false;
  } while (s.ok() && left > 0);
  return s;
}